

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O3

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::compatible
          (ClauseMatcher *this,ILStruct *bi,MatchInfo *bq,ILStruct *ni,MatchInfo *nq)

{
  LitInfo *pLVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint *puVar5;
  MatchInfo *pMVar6;
  uint uVar7;
  uint *puVar8;
  MatchInfo *pMVar9;
  MatchInfo *pMVar10;
  uint uVar11;
  MatchInfo *pMVar12;
  long lVar13;
  bool bVar14;
  
  pLVar1 = (this->lInfos)._array;
  if ((pLVar1[*(uint *)bq].litIndex == pLVar1[*(uint *)nq].litIndex) ||
     ((pLVar1[*(uint *)bq].opposite == true && (pLVar1[*(uint *)nq].opposite != false)))) {
LAB_002b7ab3:
    bVar4 = false;
  }
  else {
    uVar11 = bi->varCnt;
    uVar7 = ni->varCnt;
    bVar4 = true;
    if (uVar7 != 0 && uVar11 != 0) {
      pMVar9 = nq + 8;
      puVar5 = ni->sortedGlobalVarNumbers;
      pMVar6 = bq + 8;
      puVar8 = bi->sortedGlobalVarNumbers;
      while( true ) {
        pMVar10 = pMVar6;
        while (pMVar12 = pMVar9, *puVar8 < *puVar5) {
          puVar8 = puVar8 + 1;
          pMVar10 = pMVar10 + 8;
          uVar11 = uVar11 - 1;
          if (uVar11 == 0) {
            return true;
          }
        }
        while (*puVar5 < *puVar8) {
          puVar5 = puVar5 + 1;
          uVar7 = uVar7 - 1;
          pMVar12 = pMVar12 + 8;
          if (uVar7 == 0) {
            return true;
          }
        }
        if (uVar7 == 0) break;
        lVar13 = 0;
        pMVar6 = pMVar10;
        pMVar9 = pMVar12;
        uVar2 = uVar7;
        uVar3 = uVar11;
        while (uVar11 = uVar3, uVar7 = uVar2,
              *(int *)((long)puVar8 + lVar13) == *(int *)((long)puVar5 + lVar13)) {
          if (*(long *)(pMVar10 + lVar13 * 2) != *(long *)(pMVar12 + lVar13 * 2)) goto LAB_002b7ab3;
          uVar11 = uVar3 - 1;
          pMVar6 = pMVar6 + 8;
          uVar7 = uVar2 - 1;
          pMVar9 = pMVar9 + 8;
          lVar13 = lVar13 + 4;
          if ((uVar3 == 1) || (bVar14 = uVar2 == 1, uVar2 = uVar7, uVar3 = uVar11, bVar14)) break;
        }
        puVar8 = (uint *)((long)puVar8 + lVar13);
        puVar5 = (uint *)((long)puVar5 + lVar13);
        if (uVar11 == 0) {
          return true;
        }
        if (uVar7 == 0) {
          return true;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::compatible(ILStruct* bi, MatchInfo* bq, ILStruct* ni, MatchInfo* nq)
{
  if( lInfos[bq->liIndex].litIndex==lInfos[nq->liIndex].litIndex ||
      (lInfos[bq->liIndex].opposite && lInfos[nq->liIndex].opposite) ) {
    return false;
  }

  unsigned bvars=bi->varCnt;
  unsigned* bgvn=bi->sortedGlobalVarNumbers;
  TermList* bb=bq->bindings;

  unsigned nvars=ni->varCnt;
  unsigned* ngvn=ni->sortedGlobalVarNumbers;
  TermList* nb=nq->bindings;

  while(bvars && nvars) {
    while(bvars && *bgvn<*ngvn) {
      bvars--;
      bgvn++;
      bb++;
    }
    if(!bvars) {
      break;
    }
    while(nvars && *bgvn>*ngvn) {
      nvars--;
      ngvn++;
      nb++;
    }
    while(bvars && nvars && *bgvn==*ngvn) {
      if(*bb!=*nb) {
	return false;
      }
      bvars--;
      bgvn++;
      bb++;
      nvars--;
      ngvn++;
      nb++;
    }
  }

  return true;
}